

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

void BayesianGameIdenticalPayoff::SaveTextFormat(BayesianGameIdenticalPayoff *bg,string *filename)

{
  byte bVar1;
  char *pcVar2;
  undefined8 uVar3;
  ostream *poVar4;
  ulong uVar5;
  void *this;
  long lVar6;
  size_t sVar7;
  string *in_RSI;
  long *in_RDI;
  double dVar8;
  Index jaI;
  Index jtI_1;
  Index jtI;
  Index i_1;
  Index i;
  stringstream ss;
  ofstream fp;
  undefined4 in_stack_fffffffffffffb38;
  Index in_stack_fffffffffffffb3c;
  BayesianGameBase *in_stack_fffffffffffffb40;
  BayesianGameBase *in_stack_fffffffffffffb50;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  uint local_3d0;
  stringstream local_3a8 [16];
  ostream local_398 [392];
  long local_210 [64];
  string *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar2,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_210,"# BayesianGameIdenticalPayoff text format.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    uVar5 = (**(code **)(*local_8 + 0x18))();
    this = (void *)std::ostream::operator<<(local_210,uVar5);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_3d0 = 0;
    while( true ) {
      uVar5 = (**(code **)(*local_8 + 0x18))();
      if (local_3d0 == uVar5) break;
      uVar5 = (**(code **)(*local_8 + 0x20))(local_8,local_3d0);
      std::ostream::operator<<(local_210,uVar5);
      lVar6 = (**(code **)(*local_8 + 0x18))();
      if ((ulong)local_3d0 != lVar6 - 1U) {
        std::operator<<((ostream *)local_210," ");
      }
      local_3d0 = local_3d0 + 1;
    }
    std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
    local_3d4 = 0;
    while( true ) {
      uVar5 = (**(code **)(*local_8 + 0x18))();
      if (local_3d4 == uVar5) break;
      sVar7 = BayesianGameBase::GetNrTypes(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
      std::ostream::operator<<(local_210,sVar7);
      lVar6 = (**(code **)(*local_8 + 0x18))();
      if ((ulong)local_3d4 != lVar6 - 1U) {
        std::operator<<((ostream *)local_210," ");
      }
      local_3d4 = local_3d4 + 1;
    }
    std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
    std::ios_base::precision((ios_base *)((long)local_210 + *(long *)(local_210[0] + -0x18)),0x10);
    local_3d8 = 0;
    while( true ) {
      sVar7 = BayesianGameBase::GetNrJointTypes(in_stack_fffffffffffffb50);
      if (local_3d8 == sVar7) break;
      dVar8 = (double)(**(code **)(*local_8 + 0x68))(local_8,local_3d8);
      std::ostream::operator<<(local_210,dVar8);
      sVar7 = BayesianGameBase::GetNrJointTypes(in_stack_fffffffffffffb50);
      if ((ulong)local_3d8 != sVar7 - 1) {
        std::operator<<((ostream *)local_210," ");
      }
      local_3d8 = local_3d8 + 1;
    }
    std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
    local_3dc = 0;
    while( true ) {
      sVar7 = BayesianGameBase::GetNrJointTypes(in_stack_fffffffffffffb50);
      if (local_3dc == sVar7) break;
      local_3e0 = 0;
      while( true ) {
        sVar7 = BayesianGameBase::GetNrJointActions(in_stack_fffffffffffffb50);
        if (sVar7 <= local_3e0) break;
        in_stack_fffffffffffffb50 =
             (BayesianGameBase *)(**(code **)(*local_8 + 0x80))(local_8,local_3dc,local_3e0);
        std::ostream::operator<<(local_210,(double)in_stack_fffffffffffffb50);
        uVar5 = (ulong)local_3e0;
        sVar7 = BayesianGameBase::GetNrJointActions(in_stack_fffffffffffffb50);
        if (uVar5 != sVar7 - 1) {
          std::operator<<((ostream *)local_210," ");
        }
        local_3e0 = local_3e0 + 1;
      }
      std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
      local_3dc = local_3dc + 1;
    }
    std::ofstream::~ofstream(local_210);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3a8);
  poVar4 = std::operator<<(local_398,"BayesianGameIdenticalPayoff::SaveTextFormat could not open ");
  std::operator<<(poVar4,local_10);
  uVar3 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  E::E((E *)in_stack_fffffffffffffb40,
       (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

void BayesianGameIdenticalPayoff::SaveTextFormat(const BayesianGameIdenticalPayoff &bg,
                                                 const string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "BayesianGameIdenticalPayoff::SaveTextFormat could not open "
           << filename;
        throw(E(ss.str()));
    }

    fp << "# BayesianGameIdenticalPayoff text format." << endl;
    fp << bg.GetNrAgents() << endl;
    for(Index i=0;i!=bg.GetNrAgents();++i)
    {
        fp << bg.GetNrActions(i);
        if(i!=(bg.GetNrAgents()-1))
            fp << " ";
    }
    fp << endl;
    for(Index i=0;i!=bg.GetNrAgents();++i)
    {
        fp << bg.GetNrTypes(i);
        if(i!=(bg.GetNrAgents()-1))
            fp << " ";
    }
    fp << endl;
    fp.precision(16);
    for(Index jtI=0;jtI!=bg.GetNrJointTypes();++jtI)
    {
        fp << bg.GetProbability(jtI);
        if(jtI!=(bg.GetNrJointTypes()-1))
            fp << " ";
    }
    fp << endl;
    for(Index jtI=0;jtI!=bg.GetNrJointTypes();++jtI)
    {
        for(Index jaI=0; jaI < bg.GetNrJointActions(); ++jaI)
        {
            fp << bg.GetUtility(jtI,jaI);
            if(jaI!=(bg.GetNrJointActions()-1))
                fp << " ";
        }
        fp << endl;
    }
}